

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::Triplet::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,Triplet *this,
          Vector3d *position)

{
  double dVar1;
  Index IVar2;
  Index size;
  double *pdVar3;
  Vector3d *pVVar4;
  undefined8 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  Index index_1;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  VectorXd pv;
  ActualDstType actualDst;
  assign_op<double,_double> local_59;
  Matrix<double,__1,_1,_0,__1,_1> local_58;
  DenseStorage<double,__1,__1,_1,_0> local_48;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_30;
  
  local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pdVar3 = (double *)malloc(0x18);
  if (((ulong)pdVar3 & 0xf) != 0) {
LAB_00133a76:
    __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                  ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
  }
  if (pdVar3 == (double *)0x0) {
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = std::random_device::_M_fini;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_48.m_rows = (Index)&this->_basis;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3;
  local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar3;
  local_48.m_data = (double *)position;
  local_30.m_xpr = &local_58;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Matrix<double,3,3,0,3,3>,1>,Eigen::internal::assign_op<double,double>>
            ((Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_30,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>
              *)&local_48,&local_59);
  if (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 1)
  {
LAB_00133a57:
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  if (-1e-11 <= *local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data) {
    if ((Matrix3d *)
        local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        (Matrix3d *)0x1) goto LAB_00133a57;
    if (-1e-11 <= local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data[1]) {
      if ((ulong)local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows < (Matrix3d *)0x3) goto LAB_00133a57;
      if (-1e-11 <= local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[2]) {
        local_48.m_rows =
             (Index)local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data;
        local_30.m_xpr = &local_58;
        auVar9._0_8_ = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)&local_48,(scalar_sum_op<double,_double> *)&local_59,&local_30)
        ;
        IVar2 = local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
        pdVar3 = local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        if (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            < 0) {
LAB_00133ac3:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        auVar9._8_8_ = 0;
        auVar9 = sqrtpd(auVar9,auVar9);
        puVar6 = (undefined1 *)
                 (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows & 0x7ffffffffffffffe);
        dVar8 = auVar9._0_8_;
        if ((Matrix3d *)0x1 <
            (ulong)local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_rows) {
          auVar10._8_8_ = dVar8;
          auVar10._0_8_ = dVar8;
          puVar7 = (undefined1 *)0x0;
          do {
            auVar9 = divpd(*(undefined1 (*) [16])
                            (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             .m_storage.m_data + (long)puVar7),auVar10);
            *(undefined1 (*) [16])
             (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data + (long)puVar7) = auVar9;
            puVar7 = puVar7 + 2;
          } while (puVar7 < puVar6);
        }
        if ((long)puVar6 <
            local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           ) {
          do {
            local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [(long)puVar6] =
                 local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[(long)puVar6] / dVar8;
            puVar6 = puVar6 + 1;
          } while ((undefined1 *)
                   local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                   .m_rows != puVar6);
        }
        if (local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            < 0) goto LAB_00133ac3;
        local_48.m_data = (double *)0x0;
        local_48.m_rows = 0;
        if ((Matrix3d *)
            local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            == (Matrix3d *)0x0) {
          puVar6 = (undefined1 *)0x0;
        }
        else {
          if ((Matrix3d *)0x1fffffffffffffff <
              (ulong)local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows) {
LAB_00133ae2:
            puVar5 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar5 = std::random_device::_M_fini;
            __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pVVar4 = (Vector3d *)
                   malloc(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows * 8);
          auVar9 = _DAT_0019aca0;
          if ((Matrix3d *)IVar2 != (Matrix3d *)0x1 && ((ulong)pVVar4 & 0xf) != 0) goto LAB_00133a76;
          if (pVVar4 == (Vector3d *)0x0) goto LAB_00133ae2;
          local_48.m_rows = IVar2;
          local_48.m_data = (double *)pVVar4;
          if ((Matrix3d *)IVar2 == (Matrix3d *)0x1) {
            puVar6 = (undefined1 *)0x0;
          }
          else {
            puVar6 = (undefined1 *)(IVar2 & 0x1ffffffffffffffe);
            puVar7 = (undefined1 *)0x0;
            do {
              auVar10 = maxpd(ZEXT816(0),*(undefined1 (*) [16])(pdVar3 + (long)puVar7));
              auVar10 = minpd(auVar9,auVar10);
              *(undefined1 (*) [16])
               ((pVVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array + (long)puVar7) = auVar10;
              puVar7 = puVar7 + 2;
            } while (puVar7 < puVar6);
          }
        }
        if ((long)puVar6 < IVar2) {
          do {
            dVar8 = pdVar3[(long)puVar6];
            dVar1 = 0.0;
            if (0.0 <= dVar8) {
              dVar1 = dVar8;
            }
            dVar8 = 1.0;
            if (dVar1 <= 1.0) {
              dVar8 = dVar1;
            }
            (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_48.m_data)->m_storage)
            .m_data.array[(long)puVar6] = dVar8;
            puVar6 = puVar6 + 1;
          } while ((undefined1 *)IVar2 != puVar6);
        }
        (__return_storage_ptr__->super_type).m_initialized = false;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)
                   &(__return_storage_ptr__->super_type).m_storage,&local_48);
        (__return_storage_ptr__->super_type).m_initialized = true;
        free(local_48.m_data);
        goto LAB_001338b9;
      }
    }
  }
  (__return_storage_ptr__->super_type).m_initialized = false;
LAB_001338b9:
  free(local_58.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> Triplet::handle(
      Eigen::Vector3d position) const {
    Eigen::VectorXd pv = position.transpose() * _basis;
    double epsilon = -1e-11;
    if (pv(0) >= epsilon && pv(1) >= epsilon && pv(2) >= epsilon) {
      pv /= pv.norm();
      return pv.cwiseMax(0.0).cwiseMin(1.0).eval();
    }
    return boost::none;
  }